

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

PropertyId Js::JavascriptProxy::EnsureHandlerPropertyId(ScriptContext *scriptContext)

{
  ThreadContext *this;
  int iVar1;
  LPCWSTR pWVar2;
  LPCWSTR string;
  size_t sVar3;
  PropertyRecord *pPVar4;
  CharacterBuffer<char16_t> local_38;
  
  this = scriptContext->threadContext;
  iVar1 = this->handlerPropertyId;
  if (iVar1 == -1) {
    pWVar2 = ThreadContext::GetAutoProxyName(this);
    string = DAT_0145c370;
    if (pWVar2 != (LPCWSTR)0x0) {
      string = ThreadContext::GetAutoProxyName(this);
    }
    sVar3 = PAL_wcslen(string);
    Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet(&local_38.string,string);
    local_38.len = (Type)sVar3;
    pPVar4 = ThreadContext::GetOrAddPropertyRecordBind(this,&local_38);
    iVar1 = pPVar4->pid;
    this->handlerPropertyId = iVar1;
  }
  return iVar1;
}

Assistant:

PropertyId JavascriptProxy::EnsureHandlerPropertyId(ScriptContext* scriptContext)
    {
        ThreadContext* threadContext = scriptContext->GetThreadContext();
        if (threadContext->handlerPropertyId == Js::Constants::NoProperty)
        {
            LPCWSTR autoProxyName;

            if (threadContext->GetAutoProxyName() != nullptr)
            {
                autoProxyName = threadContext->GetAutoProxyName();
            }
            else
            {
                autoProxyName = Js::Configuration::Global.flags.autoProxy;
            }

            threadContext->handlerPropertyId = threadContext->GetOrAddPropertyRecordBind(
                JsUtil::CharacterBuffer<WCHAR>(autoProxyName, static_cast<charcount_t>(wcslen(autoProxyName))))->GetPropertyId();
        }
        return threadContext->handlerPropertyId;
    }